

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

MemberIterator __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
MemberBegin(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *this)

{
  RapidJSONException *this_00;
  long in_RSI;
  
  if (*(short *)(in_RSI + 0xe) == 3) {
    (this->data_).n = (Number)(*(ulong *)(in_RSI + 8) & 0xffffffffffff);
    return (MemberIterator)(Pointer)this;
  }
  this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
  cereal::RapidJSONException::RapidJSONException
            (this_00,"rapidjson internal assertion failure: IsObject()");
  __cxa_throw(this_00,&cereal::RapidJSONException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool IsObject() const { return data_.f.flags == kObjectFlag; }